

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void http_wr_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x3e0));
  if (*(nni_aio **)((long)arg + 0x48) == aio) {
    *(undefined8 *)((long)arg + 0x48) = 0;
    nni_aio_abort((nni_aio *)((long)arg + 0x218),rv);
  }
  else {
    iVar1 = nni_aio_list_active(aio);
    if (iVar1 == 0) goto LAB_00135f13;
    nni_aio_list_remove(aio);
  }
  nni_aio_finish_error(aio,rv);
LAB_00135f13:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x3e0));
  return;
}

Assistant:

static void
http_wr_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_http_conn *conn = arg;

	nni_mtx_lock(&conn->mtx);
	if (aio == conn->wr_uaio) {
		conn->wr_uaio = NULL;
		nni_aio_abort(&conn->wr_aio, rv);
		nni_aio_finish_error(aio, rv);
	} else if (nni_aio_list_active(aio)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&conn->mtx);
}